

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

HelicsQuery helicsCreateQuery(char *target,char *query)

{
  QueryObject *this;
  allocator<char> local_3a;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = (QueryObject *)operator_new(0x80);
  helics::QueryObject::QueryObject(this);
  if (query == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_38,&gHelicsEmptyStr_abi_cxx11_);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,query,&local_39);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->query,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (target == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_38,&gHelicsEmptyStr_abi_cxx11_);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,target,&local_3a);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this->valid = 0x27063885;
  return this;
}

Assistant:

HelicsQuery helicsCreateQuery(const char* target, const char* query)
{
    auto* queryObj = new helics::QueryObject;
    queryObj->query = AS_STRING(query);
    queryObj->target = AS_STRING(target);
    queryObj->valid = validQueryIdentifier;
    return reinterpret_cast<void*>(queryObj);
}